

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O3

RowVector __thiscall
rek::Solver::solve(Solver *this,Matrix<double,__1,__1,_0,__1,__1> *AColMajor,
                  Matrix<double,__1,__1,_1,__1,__1> *ARowMajor,RowVector *b,long maxIterations,
                  double tolerance)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar7;
  XprTypeNested pMVar8;
  double *pdVar9;
  double dVar10;
  bool bVar11;
  void *pvVar12;
  undefined8 *puVar13;
  char *pcVar14;
  ulong uVar15;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar16;
  Index extraout_RDX;
  XprTypeNested pMVar17;
  double *pdVar18;
  XprTypeNested pMVar19;
  double *pdVar20;
  ulong in_R9;
  ulong uVar21;
  Scalar SVar22;
  Scalar SVar23;
  double dVar24;
  RowVector RVar25;
  RowVector z;
  scalar_sum_op<double,_double> local_101;
  void *local_100;
  DenseStorage<double,__1,__1,_1,_0> local_f8;
  DenseStorage<double,__1,__1,_1,_0> *local_e8;
  void *local_e0;
  ulong local_d8;
  Matrix<double,__1,__1,_1,__1,__1> *local_d0;
  ulong local_c8;
  Matrix<double,__1,__1,_1,__1,__1> *local_c0;
  undefined1 local_b8 [24];
  variable_if_dynamic<long,__1> local_a0;
  variable_if_dynamic<long,__1> local_98;
  variable_if_dynamic<long,__1> local_90;
  variable_if_dynamic<long,__1> local_88;
  XprTypeNested local_80;
  ulong local_70;
  Matrix<double,__1,__1,_0,__1,__1> *local_68;
  undefined1 local_60 [32];
  variable_if_dynamic<long,__1> local_40;
  double local_38;
  
  local_c0 = (Matrix<double,__1,__1,_1,__1,__1> *)
             (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar21 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
           m_cols;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 2) = 0;
  local_e8 = (DenseStorage<double,__1,__1,_1,_0> *)maxIterations;
  local_68 = AColMajor;
  local_38 = tolerance;
  if (-1 < (long)uVar21) {
    local_70 = in_R9;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this,uVar21,uVar21,1);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_f8,local_e8);
    pMVar16 = (Matrix<double,__1,__1,_1,__1,__1> *)
              (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
              m_storage.m_rows;
    local_d0 = pMVar16;
    if ((long)pMVar16 < 0) goto LAB_00104018;
    if (pMVar16 == (Matrix<double,__1,__1,_1,__1,__1> *)0x0) {
      pvVar12 = (void *)0x0;
    }
    else {
      if ((Matrix<double,__1,__1,_1,__1,__1> *)0x1fffffffffffffff < pMVar16) {
LAB_0010381c:
        puVar13 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar13 = srand;
        __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pvVar12 = malloc((long)pMVar16 * 8);
      if (pMVar16 != (Matrix<double,__1,__1,_1,__1,__1> *)0x1 && ((ulong)pvVar12 & 0xf) != 0)
      goto LAB_00104037;
      if (pvVar12 == (void *)0x0) goto LAB_0010381c;
    }
    uVar4 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
            m_cols;
    local_d8 = uVar4;
    if (-1 < (long)uVar4) {
      local_e0 = pvVar12;
      if (uVar4 != 0) {
        if (uVar4 < 0x2000000000000000) {
          local_100 = malloc(uVar4 * 8);
          if (uVar4 != 1 && ((ulong)local_100 & 0xf) != 0) {
LAB_00104037:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (local_100 != (void *)0x0) goto LAB_001038d4;
        }
        puVar13 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar13 = srand;
        __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_100 = (void *)0x0;
LAB_001038d4:
      lVar5 = *(long *)(this + 2);
      local_c8 = uVar21;
      if (lVar5 < 0) {
        pcVar14 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
        ;
LAB_00103f8b:
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar14);
      }
      if (lVar5 != 0) {
        memset(*(void **)this,0,lVar5 << 3);
      }
      if (0 < (long)local_c0) {
        pMVar16 = (Matrix<double,__1,__1,_1,__1,__1> *)0x0;
        do {
          pdVar6 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          pMVar7 = (Matrix<double,__1,__1,_1,__1,__1> *)
                   b[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
          if ((long)pMVar7 < 0 && pdVar6 != (double *)0x0) goto LAB_00103e81;
          if ((b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)pMVar16) goto LAB_00103e98;
          local_b8._0_8_ = pdVar6 + (long)pMVar7 * (long)pMVar16;
          local_90.m_value = 0;
          local_b8._16_8_ = pMVar7;
          local_a0.m_value = (long)b;
          local_98.m_value = (long)pMVar16;
          local_88.m_value = (long)pMVar7;
          if (pMVar7 == (Matrix<double,__1,__1,_1,__1,__1> *)0x0) {
            SVar22 = 0.0;
          }
          else {
            if ((long)pMVar7 < 1) {
              pcVar14 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              goto LAB_0010400e;
            }
            local_60._8_8_ = local_b8._0_8_;
            local_60._24_8_ = pMVar7;
            SVar22 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
                                 *)local_60,&local_101,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                                 *)local_b8);
          }
          if (local_d0 == pMVar16) goto LAB_00103e62;
          *(Scalar *)((long)local_e0 + (long)pMVar16 * 8) = SVar22;
          pMVar16 = (Matrix<double,__1,__1,_1,__1,__1> *)
                    ((long)&(pMVar16->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                            m_storage.m_data + 1);
        } while (local_c0 != pMVar16);
      }
      if (local_c8 != 0) {
        uVar21 = 0;
        do {
          pdVar6 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                   m_storage.m_data;
          pMVar16 = (Matrix<double,__1,__1,_1,__1,__1> *)
                    (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                    m_storage.m_rows;
          if ((long)pMVar16 < 0 && pdVar6 != (double *)0x0) goto LAB_00103eaf;
          if ((ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
              m_storage.m_cols <= (long)uVar21) goto LAB_00103ece;
          local_b8._0_8_ = pdVar6 + (long)pMVar16 * uVar21;
          local_98.m_value = 0;
          local_b8._8_8_ = pMVar16;
          local_a0.m_value = (long)ARowMajor;
          local_90.m_value = uVar21;
          local_88.m_value = (long)pMVar16;
          if (pMVar16 == (Matrix<double,__1,__1,_1,__1,__1> *)0x0) {
            SVar23 = 0.0;
          }
          else {
            if ((long)pMVar16 < 1) {
              pcVar14 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              goto LAB_0010400e;
            }
            local_60._8_8_ = local_b8._0_8_;
            local_60._24_8_ = pMVar16;
            SVar23 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                                 *)local_60,&local_101,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                                 *)local_b8);
          }
          if (local_d8 == uVar21) goto LAB_00103e62;
          *(Scalar *)((long)local_100 + uVar21 * 8) = SVar23;
          uVar21 = uVar21 + 1;
        } while (local_c8 != uVar21);
      }
      pvVar12 = local_100;
      if (0 < (long)local_70) {
        uVar21 = 0;
        do {
          pvVar12 = local_100;
          uVar4 = uVar21 + 1;
          if (((long)uVar4 %
               (long)*(int *)&(local_68->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data == 0) &&
             (bVar11 = hasConvergedDense((Solver *)local_68,(Matrix<double,__1,__1,_1,__1,__1> *)b,
                                         (Matrix<double,__1,__1,_0,__1,__1> *)ARowMajor,
                                         (RowVector *)this,(RowVector *)local_e8,
                                         (RowVector *)&local_f8,local_38), bVar11)) break;
          uVar15 = (long)uVar21 % (long)local_c0;
          pMVar16 = (Matrix<double,__1,__1,_1,__1,__1> *)(uVar21 % local_c8);
          pdVar6 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                   m_storage.m_data;
          pMVar8 = (XprTypeNested)
                   (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                   m_storage.m_rows;
          if ((long)pMVar8 < 0 && pdVar6 != (double *)0x0) goto LAB_00103eaf;
          if ((ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
              m_storage.m_cols <= (long)pMVar16) goto LAB_00103ece;
          if ((XprTypeNested)local_f8.m_rows != pMVar8) {
            pcVar14 = 
            "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
            ;
LAB_00103f4d:
            __assert_fail("size() == other.size()","/usr/include/eigen3/Eigen/src/Core/Dot.h",0x52,
                          pcVar14);
          }
          local_b8._8_8_ = pdVar6 + (long)pMVar8 * (long)pMVar16;
          local_b8._0_8_ = &local_f8;
          local_90.m_value = 0;
          local_b8._16_8_ = pMVar8;
          local_98.m_value = (long)ARowMajor;
          local_88.m_value = (long)pMVar16;
          local_80 = pMVar8;
          if (pMVar8 == (XprTypeNested)0x0) {
            dVar24 = 0.0;
          }
          else {
            if ((long)pMVar8 < 1) {
              pcVar14 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              local_98.m_value = (long)ARowMajor;
LAB_0010400e:
              __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                            "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar14);
            }
            local_60._8_8_ = local_f8.m_data;
            local_60._16_8_ = local_b8._8_8_;
            local_40.m_value = (long)pMVar8;
            dVar24 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                                 *)local_60,&local_101,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                                 *)local_b8);
          }
          if ((long)local_d8 <= (long)pMVar16) {
LAB_00103e62:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar6 = (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                   m_storage.m_data;
          pMVar8 = (XprTypeNested)
                   (ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                   m_storage.m_rows;
          if ((long)pMVar8 < 0 && pdVar6 != (double *)0x0) goto LAB_00103eaf;
          if ((ARowMajor->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
              m_storage.m_cols <= (long)pMVar16) goto LAB_00103ece;
          if ((long)pMVar8 < 0) {
            pcVar14 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_00103f8b;
          }
          if ((XprTypeNested)local_f8.m_rows != pMVar8) {
            pcVar14 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>, Functor = Eigen::internal::add_assign_op<double, double>]"
            ;
LAB_00103faa:
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar14);
          }
          dVar24 = -dVar24 / *(double *)((long)local_100 + (long)pMVar16 * 8);
          pMVar17 = (XprTypeNested)((ulong)pMVar8 & 0x7ffffffffffffffe);
          if ((XprTypeNested)0x1 < pMVar8) {
            pMVar19 = (XprTypeNested)0x0;
            do {
              dVar10 = (pdVar6 + (long)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  *)&pMVar19->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                )->m_storage).m_data + (long)pMVar16 * (long)pMVar8)
                       )[1];
              dVar3 = (double)((double **)local_f8.m_data + (long)pMVar19)[1];
              ((double **)local_f8.m_data)[(long)pMVar19] =
                   (double *)
                   (pdVar6[(long)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                            *)&pMVar19->
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          )->m_storage).m_data + (long)pMVar16 * (long)pMVar8)] *
                    dVar24 + (double)((double **)local_f8.m_data)[(long)pMVar19]);
              ((double **)local_f8.m_data + (long)pMVar19)[1] = (double *)(dVar10 * dVar24 + dVar3);
              pMVar19 = (XprTypeNested)
                        ((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                                 &pMVar19->
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                                ->m_storage).m_data + 2);
            } while (pMVar19 < pMVar17);
          }
          for (; pMVar17 != pMVar8;
              pMVar17 = (XprTypeNested)
                        ((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                                 &pMVar17->
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                                ->m_storage).m_data + 1)) {
            ((double **)local_f8.m_data)[(long)pMVar17] =
                 (double *)
                 (pdVar6[(long)((long)&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                          *)&pMVar17->
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                        )->m_storage).m_data + (long)pMVar16 * (long)pMVar8)] *
                  dVar24 + (double)((double **)local_f8.m_data)[(long)pMVar17]);
          }
          pdVar6 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          pMVar8 = (XprTypeNested)
                   b[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
          if ((long)pMVar8 < 0 && pdVar6 != (double *)0x0) goto LAB_00103e81;
          if ((b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)uVar15) goto LAB_00103e98;
          if (*(XprTypeNested *)(this + 2) != pMVar8) {
            pcVar14 = 
            "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>]"
            ;
            goto LAB_00103f4d;
          }
          local_b8._8_8_ = pdVar6 + (long)pMVar8 * uVar15;
          local_88.m_value = 0;
          local_b8._0_8_ = this;
          local_a0.m_value = (long)pMVar8;
          local_98.m_value = (long)b;
          local_90.m_value = uVar15;
          local_80 = pMVar8;
          if (pMVar8 == (XprTypeNested)0x0) {
            dVar24 = 0.0;
          }
          else {
            if ((long)pMVar8 < 1) {
              pcVar14 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              local_98.m_value = (long)b;
              goto LAB_0010400e;
            }
            local_60._8_8_ = *(undefined8 *)this;
            local_60._16_8_ = local_b8._8_8_;
            local_40.m_value = (long)pMVar8;
            dVar24 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>_>
                                 *)local_60,&local_101,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                                 *)local_b8);
          }
          if (local_e8->m_rows <= (long)uVar15) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          if ((local_f8.m_rows <= (long)uVar15) || ((long)local_d0 <= (long)uVar15))
          goto LAB_00103e62;
          pdVar6 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          pdVar9 = b[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
          if ((long)pdVar9 < 0 && pdVar6 != (double *)0x0) goto LAB_00103e81;
          if ((b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= (long)uVar15) goto LAB_00103e98;
          if ((long)pdVar9 < 0) {
            pcVar14 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 1, -1>]"
            ;
            goto LAB_00103f8b;
          }
          if (*(double **)(this + 2) != pdVar9) {
            pcVar14 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 1, -1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Functor = Eigen::internal::add_assign_op<double, double>]"
            ;
            goto LAB_00103faa;
          }
          dVar24 = ((local_e8->m_data[uVar15] - (double)((double **)local_f8.m_data)[uVar15]) -
                   dVar24) / *(double *)((long)local_e0 + uVar15 * 8);
          lVar5 = *(long *)this;
          pdVar18 = (double *)((ulong)pdVar9 & 0x7ffffffffffffffe);
          if ((double *)0x1 < pdVar9) {
            pdVar20 = (double *)0x0;
            do {
              dVar10 = (pdVar6 + (long)(uVar15 * (long)pdVar9 + (long)pdVar20))[1];
              pdVar1 = (double *)(lVar5 + (long)pdVar20 * 8);
              dVar3 = pdVar1[1];
              pdVar2 = (double *)(lVar5 + (long)pdVar20 * 8);
              *pdVar2 = pdVar6[(long)(uVar15 * (long)pdVar9 + (long)pdVar20)] * dVar24 + *pdVar1;
              pdVar2[1] = dVar10 * dVar24 + dVar3;
              pdVar20 = (double *)((long)pdVar20 + 2);
            } while (pdVar20 < pdVar18);
          }
          for (; pdVar18 != pdVar9; pdVar18 = (double *)((long)pdVar18 + 1)) {
            *(double *)(lVar5 + (long)pdVar18 * 8) =
                 pdVar6[(long)(uVar15 * (long)pdVar9 + (long)pdVar18)] * dVar24 +
                 *(double *)(lVar5 + (long)pdVar18 * 8);
          }
          uVar21 = uVar4;
          pvVar12 = local_100;
        } while (uVar4 != local_70);
      }
      free(pvVar12);
      free(local_e0);
      free(local_f8.m_data);
      RVar25.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX;
      RVar25.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)this;
      return (RowVector)
             RVar25.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
  }
LAB_00104018:
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
LAB_00103eaf:
  pcVar14 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
  ;
  goto LAB_00103ec4;
LAB_00103ece:
  pcVar14 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
  ;
  goto LAB_00103ee3;
LAB_00103e81:
  pcVar14 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
  ;
LAB_00103ec4:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar14);
LAB_00103e98:
  pcVar14 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
  ;
LAB_00103ee3:
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,pcVar14);
}

Assistant:

RowVector solve(Matrix<double, Dynamic, Dynamic, ColMajor> &AColMajor,
                  Matrix<double, Dynamic, Dynamic, RowMajor> &ARowMajor,
                  const RowVector &b, long maxIterations,
                  double tolerance = tolerance_) const {
    const long m = ARowMajor.rows(), n = AColMajor.cols();
    RowVector x(AColMajor.cols());
    RowVector z(b);
    RowVector rowNorms(AColMajor.rows());
    RowVector columnNorms(AColMajor.cols());

    x.setZero();

    for (long i = 0; i < m; i++) {
      rowNorms(i) = ARowMajor.row(i).squaredNorm();
    }

    for (long j = 0; j < n; j++) {
      columnNorms(j) = AColMajor.col(j).squaredNorm();
    }

    for (long k = 0; k < maxIterations; k++) {
      // Check for convergence every blockSize_ iterations
      if ((k + 1) % blockSize_ == 0 &&
          hasConvergedDense(ARowMajor, AColMajor, x, b, z, tolerance)) {
        break;
      }

      // Extended Kaczmarz
      const long i_k = k % m;
      const long j_k = k % n;

      double val = -z.dot(AColMajor.col(j_k)) / columnNorms(j_k);
      z += val * AColMajor.col(j_k);
      val = x.dot(ARowMajor.row(i_k));
      val = (b(i_k) - z(i_k) - val) / rowNorms(i_k);

      x += val * ARowMajor.row(i_k);
    }
    return x;
  }